

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O0

StackNode * __thiscall
KokkosTools::SpaceTimeStack::StackNode::get_child
          (StackNode *this,string *child_name,StackKind child_kind)

{
  bool bVar1;
  reference pSVar2;
  pair<std::_Rb_tree_const_iterator<KokkosTools::SpaceTimeStack::StackNode>,_bool> pVar3;
  pair<std::_Rb_tree_const_iterator<KokkosTools::SpaceTimeStack::StackNode>,_bool> res;
  _Self local_c0;
  iterator it;
  StackNode candidate;
  StackKind child_kind_local;
  string *child_name_local;
  StackNode *this_local;
  
  StackNode((StackNode *)&it,this,child_name,child_kind);
  local_c0._M_node =
       (_Base_ptr)
       std::
       set<KokkosTools::SpaceTimeStack::StackNode,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
       ::find(&this->children,(StackNode *)&it);
  res._8_8_ = std::
              set<KokkosTools::SpaceTimeStack::StackNode,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
              ::end(&this->children);
  bVar1 = std::operator==(&local_c0,(_Self *)&res.second);
  if (bVar1) {
    pVar3 = std::
            set<KokkosTools::SpaceTimeStack::StackNode,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
            ::emplace<KokkosTools::SpaceTimeStack::StackNode>(&this->children,(StackNode *)&it);
    local_c0._M_node = (_Base_ptr)pVar3.first._M_node;
    res.first._M_node._0_1_ = pVar3.second;
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("res.second",
                    "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/space-time-stack/kp_space_time_stack.cpp"
                    ,0xb0,
                    "StackNode *KokkosTools::SpaceTimeStack::StackNode::get_child(std::string &&, StackKind)"
                   );
    }
  }
  pSVar2 = std::_Rb_tree_const_iterator<KokkosTools::SpaceTimeStack::StackNode>::operator*
                     (&local_c0);
  ~StackNode((StackNode *)&it);
  return pSVar2;
}

Assistant:

StackNode* get_child(std::string&& child_name, StackKind child_kind) {
    StackNode candidate(this, std::move(child_name), child_kind);
    auto it = children.find(candidate);
    if (it == children.end()) {
      auto res = children.emplace(std::move(candidate));
      it       = res.first;
      assert(res.second);
    }
    return const_cast<StackNode*>(&(*(it)));
  }